

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

int intra_edge_filter_strength(int bs0,int bs1,int delta,int type)

{
  int iVar1;
  int blk_wh;
  int strength;
  int d;
  int type_local;
  int delta_local;
  int bs1_local;
  int bs0_local;
  
  if (delta < 1) {
    delta = -delta;
  }
  strength = 0;
  iVar1 = bs0 + bs1;
  if (type == 0) {
    if (iVar1 < 9) {
      strength = (int)(0x37 < delta);
    }
    else if (iVar1 < 0xd) {
      strength = (int)(0x27 < delta);
    }
    else if (iVar1 < 0x11) {
      strength = (int)(0x27 < delta);
    }
    else if (iVar1 < 0x19) {
      strength = (int)(7 < delta);
      if (0xf < delta) {
        strength = 2;
      }
      if (0x1f < delta) {
        strength = 3;
      }
    }
    else if (iVar1 < 0x21) {
      strength = (int)(0 < delta);
      if (3 < delta) {
        strength = 2;
      }
      if (0x1f < delta) {
        strength = 3;
      }
    }
    else if (0 < delta) {
      strength = 3;
    }
  }
  else if (iVar1 < 9) {
    strength = (int)(0x27 < delta);
    if (0x3f < delta) {
      strength = 2;
    }
  }
  else if (iVar1 < 0x11) {
    strength = (int)(0x13 < delta);
    if (0x2f < delta) {
      strength = 2;
    }
  }
  else if (iVar1 < 0x19) {
    if (3 < delta) {
      strength = 3;
    }
  }
  else if (0 < delta) {
    strength = 3;
  }
  return strength;
}

Assistant:

static int intra_edge_filter_strength(int bs0, int bs1, int delta, int type) {
  const int d = abs(delta);
  int strength = 0;

  const int blk_wh = bs0 + bs1;
  if (type == 0) {
    if (blk_wh <= 8) {
      if (d >= 56) strength = 1;
    } else if (blk_wh <= 12) {
      if (d >= 40) strength = 1;
    } else if (blk_wh <= 16) {
      if (d >= 40) strength = 1;
    } else if (blk_wh <= 24) {
      if (d >= 8) strength = 1;
      if (d >= 16) strength = 2;
      if (d >= 32) strength = 3;
    } else if (blk_wh <= 32) {
      if (d >= 1) strength = 1;
      if (d >= 4) strength = 2;
      if (d >= 32) strength = 3;
    } else {
      if (d >= 1) strength = 3;
    }
  } else {
    if (blk_wh <= 8) {
      if (d >= 40) strength = 1;
      if (d >= 64) strength = 2;
    } else if (blk_wh <= 16) {
      if (d >= 20) strength = 1;
      if (d >= 48) strength = 2;
    } else if (blk_wh <= 24) {
      if (d >= 4) strength = 3;
    } else {
      if (d >= 1) strength = 3;
    }
  }
  return strength;
}